

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O2

void xercesc_4_0::XTemplateSerializer::storeObject
               (RefVectorOf<xercesc_4_0::ContentSpecNode> *objToStore,XSerializeEngine *serEng)

{
  XMLSize_t t;
  bool bVar1;
  ContentSpecNode *pCVar2;
  size_t in_RCX;
  void *__buf;
  XMLSize_t i;
  XMLSize_t getAt;
  
  bVar1 = XSerializeEngine::needToStoreObject(serEng,objToStore);
  if (bVar1) {
    t = (objToStore->super_BaseRefVectorOf<xercesc_4_0::ContentSpecNode>).fCurCount;
    XSerializeEngine::writeSize(serEng,t);
    for (getAt = 0; t != getAt; getAt = getAt + 1) {
      pCVar2 = BaseRefVectorOf<xercesc_4_0::ContentSpecNode>::elementAt
                         (&objToStore->super_BaseRefVectorOf<xercesc_4_0::ContentSpecNode>,getAt);
      XSerializeEngine::write(serEng,(int)pCVar2,__buf,in_RCX);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::storeObject(RefVectorOf<ContentSpecNode>* const objToStore
                                    , XSerializeEngine&                   serEng)
{

    if (serEng.needToStoreObject(objToStore))
    {
        XMLSize_t vectorLength = objToStore->size();
        serEng.writeSize (vectorLength);

        for ( XMLSize_t i = 0; i < vectorLength; i++)
        {
            ContentSpecNode* data = objToStore->elementAt(i);
            serEng<<data;
        }
    }

}